

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O3

SRes SeqInStream_Read(ISeqInStream *stream,void *buf,size_t size)

{
  SRes SVar1;
  size_t processed;
  size_t local_30;
  
  if (size != 0) {
    do {
      local_30 = size;
      SVar1 = (*stream->Read)(stream,buf,&local_30);
      if (SVar1 != 0) {
        return SVar1;
      }
      if (local_30 == 0) {
        return 6;
      }
      buf = (void *)((long)buf + local_30);
      size = size - local_30;
    } while (size != 0);
  }
  return 0;
}

Assistant:

SRes SeqInStream_Read(ISeqInStream *stream, void *buf, size_t size)
{
  return SeqInStream_Read2(stream, buf, size, SZ_ERROR_INPUT_EOF);
}